

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[22],kj::CappedArray<char,17ul>&,char_const(&)[4]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [22],
          CappedArray<char,_17UL> *params_1,char (*params_2) [4])

{
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  local_38 = toCharSequence<char_const(&)[22]>((char (*) [22])this);
  local_48.size_ = *(size_t *)*params;
  local_48.ptr = *params + 8;
  local_58 = toCharSequence<char_const(&)[4]>((char (*) [4])params_1);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}